

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tikz.cc
# Opt level: O0

bool lf::io::writeTikZ(Mesh *mesh,string *filename,
                      function<bool_(const_lf::mesh::Entity_&)> *selector,TikzOutputCtrl output_ctrl
                      )

{
  Entity *__args;
  byte bVar1;
  bool bVar2;
  RefElType RVar3;
  TikzOutputCtrl TVar4;
  uint uVar5;
  int iVar6;
  size_type from;
  runtime_error *this;
  ostream *poVar7;
  reference ppEVar8;
  undefined4 extraout_var;
  MatrixXd *pMVar9;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar10;
  CoeffReturnType pdVar11;
  double local_980;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_978;
  double local_950;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_948;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  local_920;
  undefined1 local_8c0 [8];
  MatrixXd scaled_vertices_2;
  double local_888;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_880;
  double local_858;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_850;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  local_828;
  undefined1 local_7c8 [8];
  MatrixXd scaled_vertices_1;
  double local_790;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_788;
  double local_760;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_758;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  local_730;
  undefined1 local_6d0 [8];
  MatrixXd semi_scaled_vertices;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_6b0;
  double local_688;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_680;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  local_658;
  undefined1 local_5f8 [8];
  MatrixXd scaled_vertices;
  Index local_5c0;
  undefined1 local_5b8 [8];
  MatrixXd center_mat;
  VectorwiseOp<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> local_598;
  SumReturnType local_590;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_580;
  undefined1 local_548 [8];
  MatrixXd center;
  MatrixXd vertices;
  MatrixXd *obj_corners;
  Geometry *obj_geo_ptr;
  int num_nodes_obj;
  RefEl obj_refel;
  size_type obj_idx;
  Entity *obj;
  iterator __end3;
  iterator __begin3;
  span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *__range3;
  int co_dim;
  size_type node_count;
  size_type no_of_nodes;
  undefined1 local_4a8 [4];
  dim_t node_codim;
  allocator<char> local_481;
  string local_480;
  allocator<char> local_459;
  string local_458;
  stringstream local_438 [8];
  stringstream ss;
  ostream local_428 [380];
  uint local_2ac;
  undefined1 local_2a8 [4];
  dim_t dim_mesh;
  undefined1 local_290 [8];
  MatrixXd zero;
  TikzOutputCtrl local_270;
  bool WithPreamble;
  TikzOutputCtrl local_268;
  bool ArrowsOn;
  TikzOutputCtrl local_260;
  bool RenderCellsOn;
  TikzOutputCtrl local_258;
  bool VerticeNumOn;
  TikzOutputCtrl local_250;
  bool CellNumOn;
  TikzOutputCtrl local_248;
  bool NodeNumOn;
  undefined4 local_240;
  bool EdgeNumOn;
  long local_230;
  ofstream outfile;
  TikzOutputCtrl local_2c;
  function<bool_(const_lf::mesh::Entity_&)> *pfStack_28;
  TikzOutputCtrl output_ctrl_local;
  function<bool_(const_lf::mesh::Entity_&)> *selector_local;
  string *filename_local;
  Mesh *mesh_local;
  
  local_2c = output_ctrl;
  pfStack_28 = selector;
  selector_local = (function<bool_(const_lf::mesh::Entity_&)> *)filename;
  filename_local = (string *)mesh;
  std::ofstream::ofstream(&local_230,(string *)filename,_S_out);
  bVar1 = std::ios::operator!((ios *)((long)&local_230 + *(long *)(local_230 + -0x18)));
  if ((bVar1 & 1) == 0) {
    local_248 = EdgeNumbering;
    TVar4 = operator&(&local_2c,&local_248);
    NodeNumOn = TVar4 != 0;
    local_250 = NodeNumbering;
    TVar4 = operator&(&local_2c,&local_250);
    CellNumOn = TVar4 != 0;
    local_258 = CellNumbering;
    TVar4 = operator&(&local_2c,&local_258);
    VerticeNumOn = TVar4 != 0;
    local_260 = VerticeNumbering;
    TVar4 = operator&(&local_2c,&local_260);
    RenderCellsOn = TVar4 != 0;
    local_268 = RenderCells;
    TVar4 = operator&(&local_2c,&local_268);
    ArrowsOn = TVar4 != 0;
    local_270 = ArrowTips;
    TVar4 = operator&(&local_2c,&local_270);
    WithPreamble = TVar4 != 0;
    zero.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._0_4_ =
         0x40;
    TVar4 = operator&(&local_2c,
                      (TikzOutputCtrl *)
                      &zero.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_cols);
    zero.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols._7_1_ =
         TVar4 != 0;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
              ((ConstantReturnType *)local_2a8,0,1);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((Matrix<double,_1,_1,0,_1,_1> *)local_290,
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                *)local_2a8);
    local_2ac = (**(code **)(filename_local->_M_dataplus)._M_p)();
    if (local_2ac != 2) {
      std::__cxx11::stringstream::stringstream(local_438);
      std::operator<<(local_428,"writeTikZ() only available for 2D meshes");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_458,"dim_mesh == 2",&local_459);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_480,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/write_tikz.cc"
                 ,&local_481);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed(&local_458,&local_480,0x39,(string *)local_4a8);
      std::__cxx11::string::~string((string *)local_4a8);
      std::__cxx11::string::~string((string *)&local_480);
      std::allocator<char>::~allocator(&local_481);
      std::__cxx11::string::~string((string *)&local_458);
      std::allocator<char>::~allocator(&local_459);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"this code should not be reached");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar5 = (**(code **)((filename_local->_M_dataplus)._M_p + 0x18))(filename_local,2);
    if ((zero.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
         _7_1_ & 1) != 0) {
      poVar7 = std::operator<<((ostream *)&local_230,
                               "\\documentclass[12pt,a4paper]{article}\n\\usepackage{tikz}\n\\begin{document}\n"
                              );
      std::operator<<(poVar7,'\n');
    }
    std::operator<<((ostream *)&local_230,"% TikZ document graphics \n");
    if (uVar5 < 0x33) {
      std::operator<<((ostream *)&local_230,
                      "\\begin{tikzpicture}[scale=4, >= stealth, inner sep=0pt, minimum size=0.35cm]\n"
                     );
    }
    else {
      std::operator<<((ostream *)&local_230,
                      "\\begin{tikzpicture}[scale=6, >= stealth, inner sep=0pt, minimum size=0.2cm]\n"
                     );
      std::operator<<((ostream *)&local_230,"\\tikzstyle{every node}=[font=\\tiny]\n");
    }
    for (__range3._4_4_ = 0; __range3._4_4_ <= local_2ac; __range3._4_4_ = __range3._4_4_ + 1) {
      __begin3._M_current =
           (Entity **)
           (**(code **)((filename_local->_M_dataplus)._M_p + 0x10))(filename_local,__range3._4_4_);
      __end3 = std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::begin
                         ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
      obj = (Entity *)
            std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>::end
                      ((span<const_lf::mesh::Entity_*const,_18446744073709551615UL> *)&__begin3);
      while (bVar2 = __gnu_cxx::
                     operator==<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                               (&__end3,(__normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                                         *)&obj), ((bVar2 ^ 0xffU) & 1) != 0) {
        ppEVar8 = __gnu_cxx::
                  __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
                  ::operator*(&__end3);
        __args = *ppEVar8;
        bVar2 = std::function<bool_(const_lf::mesh::Entity_&)>::operator()(pfStack_28,__args);
        if (bVar2) {
          uVar5 = (**(code **)((filename_local->_M_dataplus)._M_p + 0x28))(filename_local,__args);
          _num_nodes_obj = (ulong)uVar5;
          iVar6 = (*__args->_vptr_Entity[4])();
          obj_geo_ptr._7_1_ = (undefined1)iVar6;
          from = lf::base::RefEl::NumNodes((RefEl *)((long)&obj_geo_ptr + 7));
          obj_geo_ptr._0_4_ = lf::base::narrow<int,unsigned_int>(from);
          iVar6 = (*__args->_vptr_Entity[3])();
          pMVar9 = lf::base::RefEl::NodeCoords((RefEl *)((long)&obj_geo_ptr + 7));
          (**(code **)(*(long *)CONCAT44(extraout_var,iVar6) + 0x18))
                    (&center.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols,(long *)CONCAT44(extraout_var,iVar6),pMVar9);
          local_598.m_matrix =
               (ExpressionTypeNested)
               Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rowwise
                         ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                          &center.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_cols);
          Eigen::VectorwiseOp<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::sum
                    (&local_590,&local_598);
          center_mat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                             ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                              &center.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_cols);
          Eigen::
          MatrixBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,-1,-1,0,-1,-1>const,Eigen::internal::member_sum<double,double>,1>>
          ::operator/(&local_580,
                      (MatrixBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::internal::member_sum<double,double>,1>>
                       *)&local_590,
                      &center_mat.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_cols);
          Eigen::Matrix<double,-1,-1,0,-1,-1>::
          Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::internal::member_sum<double,double>,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                    ((Matrix<double,_1,_1,0,_1,_1> *)local_548,
                     (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::PartialReduxExpr<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                      *)&local_580);
          local_5c0 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                                ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                 local_548);
          Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<long,int>
                    ((Matrix<double,_1,_1,0,_1,_1> *)local_5b8,&local_5c0,(int *)&obj_geo_ptr);
          RVar3 = lf::base::RefEl::operator_cast_to_RefElType((RefEl *)((long)&obj_geo_ptr + 7));
          switch(RVar3) {
          case kPoint:
            if ((CellNumOn & 1U) == 0) {
              poVar7 = std::operator<<((ostream *)&local_230,"\\draw[red] (");
              pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                        operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                                   &center.
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    .m_storage.m_cols,0,0);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
              poVar7 = std::operator<<(poVar7,",");
              pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                        operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                                   &center.
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    .m_storage.m_cols,1,0);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
              poVar7 = std::operator<<(poVar7,") ");
              std::operator<<(poVar7,"node[] {*};\n");
            }
            else {
              poVar7 = std::operator<<((ostream *)&local_230,"\\draw[red, fill = white] (");
              pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                        operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                                   &center.
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    .m_storage.m_cols,0,0);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
              poVar7 = std::operator<<(poVar7,",");
              pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                        operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                                   &center.
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    .m_storage.m_cols,1,0);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
              poVar7 = std::operator<<(poVar7,") ");
              poVar7 = std::operator<<(poVar7,"node[draw, circle, fill = white] {");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,_num_nodes_obj);
              std::operator<<(poVar7,"};\n");
            }
            break;
          case kSegment:
            Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator<<
                      ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       &scaled_vertices.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_5b8,
                       (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_548);
            Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                       &scaled_vertices.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_548);
            Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
                      ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       &scaled_vertices.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols);
            local_688 = 0.8;
            Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                      (&local_680,
                       (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                       &center.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols,&local_688);
            semi_scaled_vertices.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols = 0x3fc999999999999a;
            Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                      (&local_6b0,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_5b8,
                       (double *)
                       &semi_scaled_vertices.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols);
            Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const>>
            ::operator+(&local_658,
                        (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                         *)&local_680,
                        (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                         *)&local_6b0);
            Eigen::Matrix<double,-1,-1,0,-1,-1>::
            Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const>>
                      ((Matrix<double,_1,_1,0,_1,_1> *)local_5f8,
                       (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                        *)&local_658);
            local_760 = 0.95;
            Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                      (&local_758,
                       (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                       &center.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols,&local_760);
            local_790 = 0.05;
            Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                      (&local_788,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_5b8,
                       &local_790);
            Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const>>
            ::operator+(&local_730,
                        (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                         *)&local_758,
                        (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                         *)&local_788);
            Eigen::Matrix<double,-1,-1,0,-1,-1>::
            Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const>>
                      ((Matrix<double,_1,_1,0,_1,_1> *)local_6d0,
                       (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                        *)&local_730);
            if ((WithPreamble & 1U) == 0) {
              if ((NodeNumOn & 1U) == 0) {
                if ((NodeNumOn & 1U) == 0) {
                  poVar7 = std::operator<<((ostream *)&local_230,"\\draw[] (");
                  pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                            operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                                        *)&center.
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                           .m_storage.m_cols,0,0);
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                  poVar7 = std::operator<<(poVar7,",");
                  pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                            operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                                        *)&center.
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                           .m_storage.m_cols,1,0);
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                  poVar7 = std::operator<<(poVar7,") -- ");
                  poVar7 = std::operator<<(poVar7,"(");
                  pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                            operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                                        *)&center.
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                           .m_storage.m_cols,0,1);
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                  poVar7 = std::operator<<(poVar7,",");
                  pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                            operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                                        *)&center.
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                           .m_storage.m_cols,1,1);
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                  std::operator<<(poVar7,");\n");
                }
                else {
                  poVar7 = std::operator<<((ostream *)&std::cout,
                                           "Check EdgeNumOn and NodeNumOn for kSegment ");
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,_num_nodes_obj);
                  std::operator<<(poVar7,'\n');
                }
              }
              else {
                poVar7 = std::operator<<((ostream *)&local_230,"\\draw[] (");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&center.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                       .m_storage.m_cols,0,0);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,",");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&center.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                       .m_storage.m_cols,1,0);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,") -- node[black] {");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,_num_nodes_obj);
                poVar7 = std::operator<<(poVar7,"} ");
                poVar7 = std::operator<<(poVar7,"(");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&center.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                       .m_storage.m_cols,0,1);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,",");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&center.
                                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                       .m_storage.m_cols,1,1);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                std::operator<<(poVar7,");\n");
              }
            }
            else if (((NodeNumOn & 1U) == 0) || ((CellNumOn & 1U) == 0)) {
              if (((CellNumOn & 1U) == 0) || ((NodeNumOn & 1U) != 0)) {
                if (((CellNumOn & 1U) == 0) && ((NodeNumOn & 1U) != 0)) {
                  poVar7 = std::operator<<((ostream *)&local_230,"\\draw[->] (");
                  pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                            operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                                        *)local_6d0,0,0);
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                  poVar7 = std::operator<<(poVar7,",");
                  pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                            operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                                        *)local_6d0,1,0);
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                  poVar7 = std::operator<<(poVar7,") -- node[black] {");
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,_num_nodes_obj);
                  poVar7 = std::operator<<(poVar7,"} ");
                  poVar7 = std::operator<<(poVar7,"(");
                  pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                            operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                                        *)local_6d0,0,1);
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                  poVar7 = std::operator<<(poVar7,",");
                  pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                            operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                                        *)local_6d0,1,1);
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                  std::operator<<(poVar7,");\n");
                }
                else if (((CellNumOn & 1U) == 0) && ((NodeNumOn & 1U) == 0)) {
                  poVar7 = std::operator<<((ostream *)&local_230,"\\draw[->] (");
                  pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                            operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                                        *)local_6d0,0,0);
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                  poVar7 = std::operator<<(poVar7,",");
                  pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                            operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                                        *)local_6d0,1,0);
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                  poVar7 = std::operator<<(poVar7,") -- ");
                  poVar7 = std::operator<<(poVar7,"(");
                  pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                            operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                                        *)local_6d0,0,1);
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                  poVar7 = std::operator<<(poVar7,",");
                  pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                            operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                                        *)local_6d0,1,1);
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                  std::operator<<(poVar7,");\n");
                }
                else {
                  poVar7 = std::operator<<((ostream *)&std::cout,
                                           "Check EdgeNumOn and NodeNumOn for kSegment ");
                  poVar7 = (ostream *)std::ostream::operator<<(poVar7,_num_nodes_obj);
                  std::operator<<(poVar7,'\n');
                }
              }
              else {
                poVar7 = std::operator<<((ostream *)&local_230,"\\draw[->] (");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_5f8,0,0);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,",");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_5f8,1,0);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,") -- ");
                poVar7 = std::operator<<(poVar7,"(");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_5f8,0,1);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,",");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_5f8,1,1);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                std::operator<<(poVar7,");\n");
              }
            }
            else {
              poVar7 = std::operator<<((ostream *)&local_230,"\\draw[->] (");
              pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                        operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                                   local_5f8,0,0);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
              poVar7 = std::operator<<(poVar7,",");
              pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                        operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                                   local_5f8,1,0);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
              poVar7 = std::operator<<(poVar7,") -- node[black] {");
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,_num_nodes_obj);
              poVar7 = std::operator<<(poVar7,"} ");
              poVar7 = std::operator<<(poVar7,"(");
              pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                        operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                                   local_5f8,0,1);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
              poVar7 = std::operator<<(poVar7,",");
              pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                        operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                                   local_5f8,1,1);
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
              std::operator<<(poVar7,");\n");
            }
            local_240 = 7;
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                      ((Matrix<double,__1,__1,_0,__1,__1> *)local_6d0);
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                      ((Matrix<double,__1,__1,_0,__1,__1> *)local_5f8);
            break;
          case kTria:
            Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator<<
                      ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       &scaled_vertices_1.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_5b8,
                       (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_548);
            pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                                ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                                 &scaled_vertices_1.
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                  m_storage.m_cols,
                                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_548);
            Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pCVar10,
                       (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_548);
            Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
                      ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       &scaled_vertices_1.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols);
            local_858 = 0.7;
            Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                      (&local_850,
                       (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                       &center.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols,&local_858);
            local_888 = 0.3;
            Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                      (&local_880,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_5b8,
                       &local_888);
            Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const>>
            ::operator+(&local_828,
                        (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                         *)&local_850,
                        (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                         *)&local_880);
            Eigen::Matrix<double,-1,-1,0,-1,-1>::
            Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const>>
                      ((Matrix<double,_1,_1,0,_1,_1> *)local_7c8,
                       (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                        *)&local_828);
            if ((ArrowsOn & 1U) != 0) {
              if ((RenderCellsOn & 1U) == 0) {
                poVar7 = std::operator<<((ostream *)&local_230,"\\draw[green] (");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_7c8,0,0);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,",");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_7c8,1,0);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,") -- (");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_7c8,0,1);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,",");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_7c8,1,1);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,") -- (");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_7c8,0,2);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,",");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_7c8,1,2);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                std::operator<<(poVar7,") -- cycle;\n");
              }
              else {
                poVar7 = std::operator<<((ostream *)&local_230,"\\draw[green] (");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_7c8,0,0);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,",");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_7c8,1,0);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,") node[] {0} -- (");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_7c8,0,1);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,",");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_7c8,1,1);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,") node[] {1} -- (");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_7c8,0,2);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,",");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_7c8,1,2);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                std::operator<<(poVar7,") node[] {2} -- cycle;\n");
              }
              if ((VerticeNumOn & 1U) != 0) {
                poVar7 = std::operator<<((ostream *)&local_230,"\\draw[green] (");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_548,0,0);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,",");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_548,1,0);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,") node[] {");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,_num_nodes_obj);
                std::operator<<(poVar7,"};\n");
              }
            }
            local_240 = 7;
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                      ((Matrix<double,__1,__1,_0,__1,__1> *)local_7c8);
            break;
          case kQuad:
            Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator<<
                      ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       &scaled_vertices_2.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols,(DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_5b8,
                       (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_548);
            pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                                ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                                 &scaled_vertices_2.
                                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                  m_storage.m_cols,
                                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_548);
            pCVar10 = Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                                ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pCVar10,
                                 (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_548);
            Eigen::CommaInitializer<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)pCVar10,
                       (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_548);
            Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer
                      ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       &scaled_vertices_2.
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_cols);
            local_950 = 0.7;
            Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                      (&local_948,
                       (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
                       &center.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols,&local_950);
            local_980 = 0.3;
            Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                      (&local_978,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_5b8,
                       &local_980);
            Eigen::
            MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,-1,0,-1,-1>const>const>>
            ::operator+(&local_920,
                        (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
                         *)&local_948,
                        (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
                         *)&local_978);
            Eigen::Matrix<double,-1,-1,0,-1,-1>::
            Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>const>>
                      ((Matrix<double,_1,_1,0,_1,_1> *)local_8c0,
                       (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                        *)&local_920);
            if ((ArrowsOn & 1U) != 0) {
              if ((RenderCellsOn & 1U) == 0) {
                poVar7 = std::operator<<((ostream *)&local_230,"\\draw[magenta] (");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_8c0,0,0);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,",");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_8c0,1,0);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,") -- (");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_8c0,0,1);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,",");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_8c0,1,1);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,") -- (");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_8c0,0,2);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,",");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_8c0,1,2);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,") -- (");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_8c0,0,3);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,",");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_8c0,1,3);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                std::operator<<(poVar7,") -- cycle;\n");
              }
              else {
                poVar7 = std::operator<<((ostream *)&local_230,"\\draw[magenta] (");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_8c0,0,0);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,",");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_8c0,1,0);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,") node[] {0} -- (");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_8c0,0,1);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,",");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_8c0,1,1);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,") node[] {1} -- (");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_8c0,0,2);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,",");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_8c0,1,2);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,") node[] {2} -- (");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_8c0,0,3);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,",");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_8c0,1,3);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                std::operator<<(poVar7,") node[] {3} -- cycle;\n");
              }
              if ((VerticeNumOn & 1U) != 0) {
                poVar7 = std::operator<<((ostream *)&local_230,"\\draw[magenta] (");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_548,0,0);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,",");
                pdVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )local_548,1,0);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,*pdVar11);
                poVar7 = std::operator<<(poVar7,") node[] {");
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,_num_nodes_obj);
                std::operator<<(poVar7,"};\n");
              }
            }
            local_240 = 7;
            Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                      ((Matrix<double,__1,__1,_0,__1,__1> *)local_8c0);
            break;
          default:
            poVar7 = std::operator<<((ostream *)&std::cout,"Error for object ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,_num_nodes_obj);
            poVar7 = std::operator<<(poVar7," in co-dim ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,__range3._4_4_);
            std::operator<<(poVar7,'\n');
            poVar7 = std::operator<<((ostream *)&std::cout,"Object type: ");
            poVar7 = lf::base::operator<<(poVar7,(RefEl *)((long)&obj_geo_ptr + 7));
            std::operator<<(poVar7,'\n');
          }
          Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                    ((Matrix<double,__1,__1,_0,__1,__1> *)local_5b8);
          Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                    ((Matrix<double,__1,__1,_0,__1,__1> *)local_548);
          Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
                    ((Matrix<double,__1,__1,_0,__1,__1> *)
                     &center.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols);
        }
        __gnu_cxx::
        __normal_iterator<const_lf::mesh::Entity_*const_*,_std::span<const_lf::mesh::Entity_*const,_18446744073709551615UL>_>
        ::operator++(&__end3);
      }
    }
    std::operator<<((ostream *)&local_230,"\\end{tikzpicture}\n");
    if ((zero.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols.
         _7_1_ & 1) != 0) {
      poVar7 = std::operator<<((ostream *)&local_230,"\n\\end{document}");
      std::operator<<(poVar7,'\n');
    }
    mesh_local._7_1_ = 1;
    local_240 = 1;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_290);
  }
  else {
    mesh_local._7_1_ = 0;
    local_240 = 1;
  }
  std::ofstream::~ofstream(&local_230);
  return (bool)(mesh_local._7_1_ & 1);
}

Assistant:

bool writeTikZ(const lf::mesh::Mesh &mesh, const std::string &filename,
               std::function<bool(const lf::mesh::Entity &)> &&selector,
               TikzOutputCtrl output_ctrl) {
  // Open output file for writing and quit in case of failure
  std::ofstream outfile(filename);
  if (!outfile) {
    return false;
  }
  // ----------------------------------------------------------------
  // For the enum flags: TikzOutputCtrl
  // NOLINTBEGIN(bugprone-non-zero-enum-to-bool-conversion)
  const bool EdgeNumOn =
      static_cast<bool>(output_ctrl & TikzOutputCtrl::EdgeNumbering);
  const bool NodeNumOn =
      static_cast<bool>(output_ctrl & TikzOutputCtrl::NodeNumbering);
  const bool CellNumOn =
      static_cast<bool>(output_ctrl & TikzOutputCtrl::CellNumbering);
  const bool VerticeNumOn =
      static_cast<bool>(output_ctrl & TikzOutputCtrl::VerticeNumbering);
  const bool RenderCellsOn =
      static_cast<bool>(output_ctrl & TikzOutputCtrl::RenderCells);
  const bool ArrowsOn =
      static_cast<bool>(output_ctrl & TikzOutputCtrl::ArrowTips);
  const bool WithPreamble =
      static_cast<bool>(output_ctrl & TikzOutputCtrl::WithPreamble);
  // NOLINTEND(bugprone-non-zero-enum-to-bool-conversion)

  using size_type = std::size_t;         // lf::base::size_type;
  using dim_t = lf::base::RefEl::dim_t;  // lf::base::dim_t;
  const Eigen::MatrixXd zero(Eigen::MatrixXd::Zero(0, 1));

  // Obtain topological dimension of the mesh
  const dim_t dim_mesh = mesh.DimMesh();
  LF_VERIFY_MSG(dim_mesh == 2, "writeTikZ() only available for 2D meshes");

  // Run through nodes
  const dim_t node_codim(dim_mesh);  // Codimension number for nodes in the mesh
  const size_type no_of_nodes =
      mesh.NumEntities(node_codim);  // No. of nodes in codimension for nodes
  size_type node_count = 0;

  // START writing to file
  if (WithPreamble) {
    outfile << "\\documentclass[12pt,a4paper]{article}\n\\usepackage{tikz}"
               "\n\\begin{document}\n"
            << '\n';
  }
  outfile << "% TikZ document graphics \n";

  // Scale font size for large meshes
  if (no_of_nodes > 50) {
    outfile << "\\begin{tikzpicture}[scale=6, >= stealth, inner sep=0pt, "
               "minimum size=0.2cm]\n";
    outfile << "\\tikzstyle{every node}=[font=\\tiny]\n";
  } else {
    outfile << "\\begin{tikzpicture}[scale=4, >= stealth, inner sep=0pt, "
               "minimum size=0.35cm]\n";
  }

  // ---------------------------------------------------------------------------

  // Loop through codimensions
  for (int co_dim = 0; co_dim <= dim_mesh; co_dim++) {
    // Loop through all types of entities
    for (const mesh::Entity *obj : mesh.Entities(co_dim)) {
      if (selector(*obj)) {  // IF SELECTOR -------
        const size_type obj_idx = mesh.Index(*obj);
        const lf::base::RefEl obj_refel = obj->RefEl();
        const int num_nodes_obj = base::narrow<int>(obj_refel.NumNodes());
        const geometry::Geometry *obj_geo_ptr = obj->Geometry();
        const Eigen::MatrixXd &obj_corners(obj_refel.NodeCoords());
        const Eigen::MatrixXd vertices = obj_geo_ptr->Global(obj_corners);
        const Eigen::MatrixXd center =
            vertices.rowwise().sum() / vertices.cols();
        Eigen::MatrixXd center_mat(center.rows(), num_nodes_obj);

        switch (obj_refel) {
          case lf::base::RefEl::kPoint(): {
            if (NodeNumOn) {
              outfile << "\\draw[red, fill = white] (" << vertices(0, 0) << ","
                      << vertices(1, 0) << ") "
                      << "node[draw, circle, fill = white] {" << obj_idx
                      << "};\n";
            } else {
              outfile << "\\draw[red] (" << vertices(0, 0) << ","
                      << vertices(1, 0) << ") " << "node[] {*};\n";
            }  // if NodeNumOn
            break;

          }  // case kPoint

          case lf::base::RefEl::kSegment(): {
            center_mat << center, center;
            const Eigen::MatrixXd scaled_vertices =
                vertices * 0.80 + center_mat * 0.2;
            const Eigen::MatrixXd semi_scaled_vertices =
                vertices * 0.95 + center_mat * 0.05;

            if (ArrowsOn) {
              if (EdgeNumOn && NodeNumOn) {
                outfile << "\\draw[->] (" << scaled_vertices(0, 0) << ","
                        << scaled_vertices(1, 0) << ") -- node[black] {"
                        << obj_idx << "} " << "(" << scaled_vertices(0, 1)
                        << "," << scaled_vertices(1, 1) << ");\n";
              } else if (NodeNumOn && !EdgeNumOn) {
                outfile << "\\draw[->] (" << scaled_vertices(0, 0) << ","
                        << scaled_vertices(1, 0) << ") -- " << "("
                        << scaled_vertices(0, 1) << "," << scaled_vertices(1, 1)
                        << ");\n";
              } else if (!NodeNumOn && EdgeNumOn) {
                outfile << "\\draw[->] (" << semi_scaled_vertices(0, 0) << ","
                        << semi_scaled_vertices(1, 0) << ") -- node[black] {"
                        << obj_idx << "} " << "(" << semi_scaled_vertices(0, 1)
                        << "," << semi_scaled_vertices(1, 1) << ");\n";
              } else if (!NodeNumOn && !EdgeNumOn) {
                outfile << "\\draw[->] (" << semi_scaled_vertices(0, 0) << ","
                        << semi_scaled_vertices(1, 0) << ") -- " << "("
                        << semi_scaled_vertices(0, 1) << ","
                        << semi_scaled_vertices(1, 1) << ");\n";
              } else {
                std::cout << "Check EdgeNumOn and NodeNumOn for kSegment "
                          << obj_idx << '\n';
              }

            } else {
              if (EdgeNumOn) {
                outfile << "\\draw[] (" << vertices(0, 0) << ","
                        << vertices(1, 0) << ") -- node[black] {" << obj_idx
                        << "} " << "(" << vertices(0, 1) << ","
                        << vertices(1, 1) << ");\n";
              } else if (!EdgeNumOn) {
                outfile << "\\draw[] (" << vertices(0, 0) << ","
                        << vertices(1, 0) << ") -- " << "(" << vertices(0, 1)
                        << "," << vertices(1, 1) << ");\n";
              } else {
                std::cout << "Check EdgeNumOn and NodeNumOn for kSegment "
                          << obj_idx << '\n';
              }
            }  // arrows on

            break;
          }  // case kSegment

          case lf::base::RefEl::kTria(): {
            center_mat << center, center, center;
            const Eigen::MatrixXd scaled_vertices =
                vertices * 0.70 + center_mat * 0.30;

            if (RenderCellsOn) {
              if (VerticeNumOn) {
                outfile << "\\draw[green] (" << scaled_vertices(0, 0) << ","
                        << scaled_vertices(1, 0) << ") node[] {0} -- ("
                        << scaled_vertices(0, 1) << "," << scaled_vertices(1, 1)
                        << ") node[] {1} -- (" << scaled_vertices(0, 2) << ","
                        << scaled_vertices(1, 2) << ") node[] {2} -- cycle;\n";
              } else {
                outfile << "\\draw[green] (" << scaled_vertices(0, 0) << ","
                        << scaled_vertices(1, 0) << ") -- ("
                        << scaled_vertices(0, 1) << "," << scaled_vertices(1, 1)
                        << ") -- (" << scaled_vertices(0, 2) << ","
                        << scaled_vertices(1, 2) << ") -- cycle;\n";
              }  // if EdgeNumOn

              if (CellNumOn) {
                outfile << "\\draw[green] (" << center(0, 0) << ","
                        << center(1, 0) << ") node[] {" << obj_idx << "};\n";
              }

            }  // RenderCellsOn
            break;
          }  // case kTria

          case lf::base::RefEl::kQuad(): {
            center_mat << center, center, center, center;
            const Eigen::MatrixXd scaled_vertices =
                vertices * 0.70 + center_mat * 0.3;

            if (RenderCellsOn) {
              if (VerticeNumOn) {
                outfile << "\\draw[magenta] (" << scaled_vertices(0, 0) << ","
                        << scaled_vertices(1, 0) << ") node[] {0} -- ("
                        << scaled_vertices(0, 1) << "," << scaled_vertices(1, 1)
                        << ") node[] {1} -- (" << scaled_vertices(0, 2) << ","
                        << scaled_vertices(1, 2) << ") node[] {2} -- ("
                        << scaled_vertices(0, 3) << "," << scaled_vertices(1, 3)
                        << ") node[] {3} -- cycle;\n";
              } else {
                outfile << "\\draw[magenta] (" << scaled_vertices(0, 0) << ","
                        << scaled_vertices(1, 0) << ") -- ("
                        << scaled_vertices(0, 1) << "," << scaled_vertices(1, 1)
                        << ") -- (" << scaled_vertices(0, 2) << ","
                        << scaled_vertices(1, 2) << ") -- ("
                        << scaled_vertices(0, 3) << "," << scaled_vertices(1, 3)
                        << ") -- cycle;\n";
              }

              if (CellNumOn) {
                outfile << "\\draw[magenta] (" << center(0, 0) << ","
                        << center(1, 0) << ") node[] {" << obj_idx << "};\n";
              }

            }  // RenderCellsOn

            break;
          }  // case kQuad

          default: {
            std::cout << "Error for object " << obj_idx << " in co-dim "
                      << co_dim << '\n';
            std::cout << "Object type: " << obj_refel << '\n';
            break;
          }  // default
        }  // switch
      }  // IF SELECTOR --------------------
    }  // for entities

    node_count++;
    // LF_VERIFY_MSG(node_count == no_of_nodes, "Node count mismatch");
  }  // for codim

  outfile << "\\end{tikzpicture}\n";
  if (WithPreamble) {
    outfile << "\n\\end{document}" << '\n';
  }
  return true;
}